

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

UChar * __thiscall
icu_63::ResourceDataValue::getAliasString
          (ResourceDataValue *this,int32_t *length,UErrorCode *errorCode)

{
  uint uVar1;
  anon_struct_8_3_a62c8074 *paVar2;
  
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if ((this->res & 0xf0000000) == 0x30000000) {
      uVar1 = this->res & 0xfffffff;
      if (uVar1 == 0) {
        paVar2 = &gEmptyString;
      }
      else {
        paVar2 = (anon_struct_8_3_a62c8074 *)((ulong)(uVar1 << 2) + (long)this->pResData->pRoot);
      }
      *length = paVar2->length;
      return &paVar2->nul;
    }
    *length = 0;
    *errorCode = U_RESOURCE_TYPE_MISMATCH;
  }
  return (UChar *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }